

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float *pfVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float w_item_last;
  float w_item_one;
  float local_38;
  float local_34;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  fVar8 = (GImGui->Style).ItemInnerSpacing.x;
  iVar4 = components + -1;
  fVar7 = (float)(int)((w_full - fVar8 * (float)iVar4) / (float)components);
  fVar9 = 1.0;
  if (1.0 <= fVar7) {
    fVar9 = fVar7;
  }
  fVar7 = (float)(int)(w_full - (fVar9 + fVar8) * (float)iVar4);
  fVar8 = 1.0;
  if (1.0 <= fVar7) {
    fVar8 = fVar7;
  }
  _local_38 = CONCAT44(fVar9,fVar8);
  this = &(pIVar1->DC).ItemWidthStack;
  ImVector<float>::push_back(this,&local_38);
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    ImVector<float>::push_back(this,&local_34);
  }
  pfVar3 = ImVector<float>::back(this);
  (pIVar1->DC).ItemWidth = *pfVar3;
  *(byte *)&(pIVar2->NextItemData).Flags = (byte)(pIVar2->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}